

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

BOOL __thiscall
Js::ScriptContext::VerifyAlive
          (ScriptContext *this,BOOL isJSFunction,ScriptContext *requestScriptContext)

{
  bool bVar1;
  ThreadContext *this_00;
  ScriptContext *local_28;
  ScriptContext *requestScriptContext_local;
  BOOL isJSFunction_local;
  ScriptContext *this_local;
  
  if (((this->super_ScriptContextBase).isClosed & 1U) == 0) {
    this_local._4_4_ = 1;
  }
  else {
    local_28 = requestScriptContext;
    if (requestScriptContext == (ScriptContext *)0x0) {
      local_28 = this;
    }
    this_00 = GetThreadContext(this);
    bVar1 = ThreadContext::RecordImplicitException(this_00);
    if (bVar1) {
      if (isJSFunction != 0) {
        JavascriptError::MapAndThrowError(local_28,-0x7ff5ec6d);
      }
      JavascriptError::MapAndThrowError(local_28,-0x7ff8fffb);
    }
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

BOOL ScriptContext::VerifyAlive(BOOL isJSFunction, ScriptContext* requestScriptContext)
    {
        if (isClosed)
        {
            if (!requestScriptContext)
            {
                requestScriptContext = this;
            }

#if ENABLE_PROFILE_INFO
            if (!GetThreadContext()->RecordImplicitException())
            {
                return FALSE;
            }
#endif
            if (isJSFunction)
            {
                Js::JavascriptError::MapAndThrowError(requestScriptContext, JSERR_CantExecute);
            }
            else
            {
                Js::JavascriptError::MapAndThrowError(requestScriptContext, E_ACCESSDENIED);
            }
        }
        return TRUE;
    }